

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer.cc
# Opt level: O0

void wabt::WriteLimits(Stream *stream,Limits *limits)

{
  uint uVar1;
  uint uVar2;
  uint32_t flags;
  Limits *limits_local;
  Stream *stream_local;
  
  uVar1 = 0;
  if ((limits->is_shared & 1U) != 0) {
    uVar1 = 2;
  }
  uVar2 = 0;
  if ((limits->is_64 & 1U) != 0) {
    uVar2 = 4;
  }
  WriteU32Leb128(stream,uVar2 | uVar1 | (limits->has_max & 1U) != 0,"limits: flags");
  WriteU32Leb128<unsigned_long>(stream,limits->initial,"limits: initial");
  if ((limits->has_max & 1U) != 0) {
    WriteU32Leb128<unsigned_long>(stream,limits->max,"limits: max");
  }
  return;
}

Assistant:

void WriteLimits(Stream* stream, const Limits* limits) {
  uint32_t flags = limits->has_max ? WABT_BINARY_LIMITS_HAS_MAX_FLAG : 0;
  flags |= limits->is_shared ? WABT_BINARY_LIMITS_IS_SHARED_FLAG : 0;
  flags |= limits->is_64 ? WABT_BINARY_LIMITS_IS_64_FLAG : 0;
  WriteU32Leb128(stream, flags, "limits: flags");
  WriteU32Leb128(stream, limits->initial, "limits: initial");
  if (limits->has_max) {
    WriteU32Leb128(stream, limits->max, "limits: max");
  }
}